

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenio::save_elements(tetgenio *this,char *filebasename)

{
  int iVar1;
  FILE *__stream;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char outelefilename [1024];
  char acStack_438 [1032];
  
  sprintf(acStack_438,"%s.ele",filebasename);
  printf("Saving elements to %s\n",acStack_438);
  __stream = fopen(acStack_438,"w");
  if (this->mesh_dim == 3) {
    fprintf(__stream,"%d  %d  %d\n",(ulong)(uint)this->numberoftetrahedra,
            (ulong)(uint)this->numberofcorners,(ulong)(uint)this->numberoftetrahedronattributes);
    if (0 < this->numberoftetrahedra) {
      iVar2 = 0;
      do {
        fprintf(__stream,"%d",(ulong)(uint)(this->firstnumber + iVar2));
        iVar1 = this->numberofcorners;
        if (0 < iVar1) {
          lVar4 = 0;
          do {
            fprintf(__stream,"  %5d",(ulong)(uint)this->tetrahedronlist[iVar1 * iVar2 + lVar4]);
            iVar1 = this->numberofcorners;
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 < iVar1);
        }
        iVar1 = this->numberoftetrahedronattributes;
        if (0 < iVar1) {
          lVar4 = 0;
          do {
            fprintf(__stream,"  %g",this->tetrahedronattributelist[iVar1 * iVar2 + lVar4]);
            iVar1 = this->numberoftetrahedronattributes;
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 < iVar1);
        }
        fputc(10,__stream);
        iVar2 = iVar2 + 1;
      } while (iVar2 < this->numberoftetrahedra);
    }
  }
  else {
    fprintf(__stream,"%d  %d  %d\n",(ulong)(uint)this->numberoftrifaces,3,
            (ulong)(this->trifacemarkerlist != (int *)0x0));
    if (0 < this->numberoftrifaces) {
      lVar4 = 0;
      lVar3 = 0;
      do {
        fprintf(__stream,"%d",(ulong)(uint)(this->firstnumber + (int)lVar3));
        lVar5 = 0;
        do {
          fprintf(__stream,"  %5d",(ulong)*(uint *)((long)this->trifacelist + lVar5 * 4 + lVar4));
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        if (this->trifacemarkerlist != (int *)0x0) {
          fprintf(__stream,"  %d",(ulong)(uint)this->trifacemarkerlist[lVar3]);
        }
        fputc(10,__stream);
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0xc;
      } while (lVar3 < this->numberoftrifaces);
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void tetgenio::save_elements(char* filebasename)
{
  FILE *fout;
  char outelefilename[FILENAMESIZE];
  int i, j;

  sprintf(outelefilename, "%s.ele", filebasename);
  printf("Saving elements to %s\n", outelefilename);
  fout = fopen(outelefilename, "w");
  if (mesh_dim == 3) {
    fprintf(fout, "%d  %d  %d\n", numberoftetrahedra, numberofcorners,
            numberoftetrahedronattributes);
    for (i = 0; i < numberoftetrahedra; i++) {
      fprintf(fout, "%d", i + firstnumber);
      for (j = 0; j < numberofcorners; j++) {
        fprintf(fout, "  %5d", tetrahedronlist[i * numberofcorners + j]);
      }
      for (j = 0; j < numberoftetrahedronattributes; j++) {
        fprintf(fout, "  %g",
          tetrahedronattributelist[i * numberoftetrahedronattributes + j]);
      }
      fprintf(fout, "\n");
    }
  } else {
    // Save a two-dimensional mesh.
    fprintf(fout, "%d  %d  %d\n",numberoftrifaces,3,trifacemarkerlist ? 1 : 0);
    for (i = 0; i < numberoftrifaces; i++) {
      fprintf(fout, "%d", i + firstnumber);
      for (j = 0; j < 3; j++) {
        fprintf(fout, "  %5d", trifacelist[i * 3 + j]);
      }
      if (trifacemarkerlist != NULL) {
        fprintf(fout, "  %d", trifacemarkerlist[i]);
      }
      fprintf(fout, "\n");
    }
  }

  fclose(fout);
}